

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

void * google::protobuf::Arena::CopyConstruct<edition_unittest::TestRequiredEnumMulti>
                 (Arena *arena,void *from)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  
  if (arena == (Arena *)0x0) {
    puVar2 = (undefined8 *)operator_new(0x28);
  }
  else {
    puVar2 = (undefined8 *)Allocate(arena,0x28);
  }
  puVar2[1] = arena;
  *puVar2 = &PTR__TestRequiredEnumMulti_01957350;
  puVar2[4] = *(undefined8 *)((long)from + 0x20);
  uVar1 = *(undefined8 *)((long)from + 0x18);
  puVar2[2] = *(undefined8 *)((long)from + 0x10);
  puVar2[3] = uVar1;
  if ((*(ulong *)((long)from + 8) & 1) != 0) {
    protobuf::internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              ((InternalMetadata *)(puVar2 + 1),
               (UnknownFieldSet *)((*(ulong *)((long)from + 8) & 0xfffffffffffffffe) + 8));
  }
  return puVar2;
}

Assistant:

PROTOBUF_NOINLINE void* PROTOBUF_NONNULL Arena::CopyConstruct(
    Arena* PROTOBUF_NULLABLE arena, const void* PROTOBUF_NONNULL from) {
  // If the object is larger than half a cache line, prefetch it.
  // This way of prefetching is a little more aggressive than if we
  // condition off a whole cache line, but benchmarks show better results.
  if (sizeof(T) > ABSL_CACHELINE_SIZE / 2) {
    PROTOBUF_PREFETCH_WITH_OFFSET(from, 64);
  }
  static_assert(is_destructor_skippable<T>::value, "");
  void* mem = arena != nullptr ? arena->AllocateAligned(sizeof(T))
                               : ::operator new(sizeof(T));
  return new (mem) T(arena, *static_cast<const T*>(from));
}